

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

void merge_new_observations(block_split_stats *stats)

{
  int *piVar1;
  long lVar2;
  
  for (lVar2 = -0x28; lVar2 != 0; lVar2 = lVar2 + 4) {
    piVar1 = (int *)((long)stats->observations + lVar2 + 0x28);
    *piVar1 = *piVar1 + *(int *)((long)stats->observations + lVar2);
    *(undefined4 *)((long)stats->observations + lVar2) = 0;
  }
  stats->num_observations = stats->num_observations + stats->num_new_observations;
  stats->num_new_observations = 0;
  return;
}

Assistant:

static void
merge_new_observations(struct block_split_stats *stats)
{
	int i;

	for (i = 0; i < NUM_OBSERVATION_TYPES; i++) {
		stats->observations[i] += stats->new_observations[i];
		stats->new_observations[i] = 0;
	}
	stats->num_observations += stats->num_new_observations;
	stats->num_new_observations = 0;
}